

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O1

ISEParams tcu::astc::anon_unknown_0::computeMaximumRangeISEParams
                    (int numAvailableBits,int numValuesInSequence)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong unaff_RBX;
  uint uVar6;
  ulong in_R11;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  
  uVar2 = 6;
  uVar6 = 5;
  uVar5 = 8;
  do {
    uVar7 = (3 << ((byte)uVar2 & 0x1f)) - 1;
    if ((int)uVar2 < 1) {
      uVar7 = 0xffffffff;
    }
    uVar1 = (5 << ((byte)uVar6 & 0x1f)) - 1;
    if ((int)uVar6 < 1) {
      uVar1 = 0xffffffff;
    }
    uVar9 = -1 << ((byte)uVar5 & 0x1f) ^ 0xffffffff;
    if ((int)uVar5 < 1) {
      uVar9 = 0xffffffff;
    }
    uVar3 = uVar1;
    if ((int)uVar1 < (int)uVar7) {
      uVar3 = uVar7;
    }
    if ((int)uVar3 <= (int)uVar9) {
      uVar3 = uVar9;
    }
    uVar8 = uVar6;
    uVar9 = uVar5;
    if (uVar3 == uVar7) {
      iVar10 = uVar2 * numValuesInSequence +
               (((numValuesInSequence * 8) / 5 + 1) -
               (uint)(numValuesInSequence * 0x66666668 + 0x19999999U < 0x33333333));
      uVar7 = uVar2 - (numAvailableBits < iVar10);
      uVar4 = 0;
      if (numAvailableBits < iVar10) goto LAB_00aca1f9;
      in_R11 = (ulong)uVar2;
      unaff_RBX = uVar4;
      uVar2 = uVar7;
    }
    else {
      uVar7 = uVar2;
      if (uVar3 == uVar1) {
        iVar10 = uVar6 * numValuesInSequence +
                 (((numValuesInSequence * 7) / 3 + 1) -
                 (uint)(numValuesInSequence * -0x55555553 + 0x2aaaaaaaU < 0x55555555));
        uVar8 = uVar6 - (numAvailableBits < iVar10);
        if (numAvailableBits < iVar10) {
LAB_00aca1f9:
          unaff_RBX = unaff_RBX & 0xffffffff;
          in_R11 = in_R11 & 0xffffffff;
          uVar4 = 1;
          uVar2 = uVar7;
          uVar6 = uVar8;
          uVar5 = uVar9;
        }
        else {
          unaff_RBX = 1;
          in_R11 = (ulong)uVar6;
          uVar4 = 0;
          uVar6 = uVar8;
        }
      }
      else {
        uVar9 = uVar5 - (numAvailableBits < (int)(uVar5 * numValuesInSequence));
        if (numAvailableBits < (int)(uVar5 * numValuesInSequence)) goto LAB_00aca1f9;
        unaff_RBX = 2;
        in_R11 = (ulong)uVar5;
        uVar4 = 0;
        uVar5 = uVar9;
      }
    }
    if ((char)uVar4 == '\0') {
      return (ISEParams)(unaff_RBX | in_R11 << 0x20);
    }
  } while( true );
}

Assistant:

ISEParams computeMaximumRangeISEParams (int numAvailableBits, int numValuesInSequence)
{
	int curBitsForTritMode		= 6;
	int curBitsForQuintMode		= 5;
	int curBitsForPlainBitMode	= 8;

	while (true)
	{
		DE_ASSERT(curBitsForTritMode > 0 || curBitsForQuintMode > 0 || curBitsForPlainBitMode > 0);

		const int tritRange			= curBitsForTritMode > 0		? (3 << curBitsForTritMode) - 1			: -1;
		const int quintRange		= curBitsForQuintMode > 0		? (5 << curBitsForQuintMode) - 1		: -1;
		const int plainBitRange		= curBitsForPlainBitMode > 0	? (1 << curBitsForPlainBitMode) - 1		: -1;
		const int maxRange			= de::max(de::max(tritRange, quintRange), plainBitRange);

		if (maxRange == tritRange)
		{
			const ISEParams params(ISEMODE_TRIT, curBitsForTritMode);
			if (computeNumRequiredBits(params, numValuesInSequence) <= numAvailableBits)
				return ISEParams(ISEMODE_TRIT, curBitsForTritMode);
			curBitsForTritMode--;
		}
		else if (maxRange == quintRange)
		{
			const ISEParams params(ISEMODE_QUINT, curBitsForQuintMode);
			if (computeNumRequiredBits(params, numValuesInSequence) <= numAvailableBits)
				return ISEParams(ISEMODE_QUINT, curBitsForQuintMode);
			curBitsForQuintMode--;
		}
		else
		{
			const ISEParams params(ISEMODE_PLAIN_BIT, curBitsForPlainBitMode);
			DE_ASSERT(maxRange == plainBitRange);
			if (computeNumRequiredBits(params, numValuesInSequence) <= numAvailableBits)
				return ISEParams(ISEMODE_PLAIN_BIT, curBitsForPlainBitMode);
			curBitsForPlainBitMode--;
		}
	}
}